

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

Point __thiscall Board::find_king(Board *this,Color color)

{
  bool bVar1;
  int iVar2;
  shared_ptr<Piece> *__a;
  __shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  bool bVar5;
  Point local_60 [4];
  byte local_4d;
  Point local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  Point local_22;
  short local_1e;
  short local_1c;
  Color local_19;
  dimension j;
  dimension i;
  Board *pBStack_18;
  Color color_local;
  Board *this_local;
  
  local_19 = color & WHITE;
  local_1c = 0;
  pBStack_18 = this;
  do {
    if (7 < local_1c) {
      Point::Point((Point *)((long)&this_local + 4),-1,-1);
      return this_local._4_4_;
    }
    for (local_1e = 0; local_1e < 8; local_1e = local_1e + 1) {
      Point::Point(&local_22,local_1e,local_1c);
      __a = TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[](&this->m_board,&local_22);
      bVar1 = std::operator!=(__a,(nullptr_t)0x0);
      local_4d = 0;
      bVar5 = false;
      if (bVar1) {
        Point::Point(&local_4c,local_1e,local_1c);
        p_Var3 = (__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[](&this->m_board,&local_4c)
        ;
        peVar4 = std::__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        (*peVar4->_vptr_Piece[3])();
        local_4d = 1;
        bVar1 = std::operator==(&local_48,"Kg");
        bVar5 = false;
        if (bVar1) {
          Point::Point(local_60,local_1e,local_1c);
          p_Var3 = (__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[]
                             (&this->m_board,local_60);
          peVar4 = std::__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var3);
          iVar2 = (*peVar4->_vptr_Piece[4])();
          bVar5 = ((Color)iVar2 & WHITE) == (local_19 & WHITE);
        }
      }
      if ((local_4d & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_48);
      }
      if (bVar5) {
        Point::Point((Point *)((long)&this_local + 4),local_1e,local_1c);
        return this_local._4_4_;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

Point Board::find_king(Color color) const {
    for (dimension i = 0; i < SIZE; i++) {
        for (dimension j = 0; j < SIZE; j++) {
            if ((m_board[{j, i}] != nullptr) && (m_board[{j, i}]->get_representation() == "Kg") &&
                (m_board[{j, i}]->get_color() == color)) {
                return Point(j, i);
            }
        }
    }

    return Point(-1, -1);
}